

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int16_t iVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  short sVar48;
  __m256i vWH_00;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  uint uVar64;
  ushort uVar65;
  short sVar66;
  undefined4 uVar67;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *piVar68;
  long lVar69;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  short sVar70;
  uint in_R9D;
  undefined1 auVar72 [16];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  long in_stack_00000008;
  int16_t value;
  __m256i cond_all;
  __m256i cond_valid_J;
  __m256i cond_valid_I;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vIBoundary;
  __m256i vJLimit1;
  __m256i vJLimit;
  __m256i vILimit1;
  __m256i vILimit;
  __m256i vMax;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vGapN;
  __m256i vN;
  __m256i vOne;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int32_t in_stack_ffffffffffffec88;
  int32_t in_stack_ffffffffffffec8c;
  undefined4 in_stack_ffffffffffffeca0;
  int local_1348;
  int local_1344;
  int *array;
  int local_1330;
  int local_132c;
  int local_1318;
  int local_1314;
  int local_1300;
  int local_12fc;
  int local_12e8;
  int local_12e4;
  int local_12d0;
  int local_12cc;
  int local_12b8;
  int local_12b4;
  int local_12a0;
  int local_129c;
  int local_1288;
  int local_1284;
  int local_1270;
  int local_126c;
  int local_1258;
  int local_1254;
  int local_1240;
  int local_123c;
  int local_1228;
  int local_1224;
  int local_1210;
  int local_120c;
  int local_11f8;
  int local_11f4;
  int local_11e0;
  int local_11dc;
  uint local_1188;
  undefined1 local_1040 [32];
  undefined1 local_1020 [24];
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [24];
  undefined8 uStack_fc8;
  undefined1 local_fc0 [24];
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined1 local_f00 [24];
  undefined8 uStack_ee8;
  undefined1 local_ec0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  ushort local_d36;
  int local_d30;
  int local_d2c;
  uint local_d28;
  uint local_d24;
  int16_t *local_ce8;
  ushort local_cd4;
  ushort local_cc4;
  ushort local_cc0;
  ushort local_cbc;
  parasail_result_t *local_ca0;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  
  local_ce8 = (int16_t *)0x0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_avx2_256_16","_s2");
    local_ca0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_avx2_256_16","s2Len");
    local_ca0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_avx2_256_16","open");
    local_ca0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_avx2_256_16","gap");
    local_ca0 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_avx2_256_16","matrix");
    local_ca0 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_avx2_256_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_avx2_256_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1188 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_1188 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_d2c = local_1188 - 1;
    local_d30 = in_ECX - 1;
    local_cc0 = (ushort)in_R8D;
    local_d36 = local_cc0;
    if (*(int *)(in_stack_00000008 + 0x20) <= (int)-in_R8D) {
      local_d36 = -(short)*(undefined4 *)(in_stack_00000008 + 0x20);
    }
    local_d36 = local_d36 + 0x8001;
    uVar65 = ((ushort)*(undefined4 *)(in_stack_00000008 + 0x1c) ^ 0x7fff) - 1;
    auVar34 = vpinsrw_avx(ZEXT216(local_d36),(uint)local_d36,1);
    auVar34 = vpinsrw_avx(auVar34,(uint)local_d36,2);
    auVar34 = vpinsrw_avx(auVar34,(uint)local_d36,3);
    auVar34 = vpinsrw_avx(auVar34,(uint)local_d36,4);
    auVar34 = vpinsrw_avx(auVar34,(uint)local_d36,5);
    auVar34 = vpinsrw_avx(auVar34,(uint)local_d36,6);
    auVar34 = vpinsrw_avx(auVar34,(uint)local_d36,7);
    auVar35 = vpinsrw_avx(ZEXT216(local_d36),(uint)local_d36,1);
    auVar35 = vpinsrw_avx(auVar35,(uint)local_d36,2);
    auVar35 = vpinsrw_avx(auVar35,(uint)local_d36,3);
    auVar35 = vpinsrw_avx(auVar35,(uint)local_d36,4);
    auVar35 = vpinsrw_avx(auVar35,(uint)local_d36,5);
    auVar35 = vpinsrw_avx(auVar35,(uint)local_d36,6);
    auVar35 = vpinsrw_avx(auVar35,(uint)local_d36,7);
    uStack_c70 = auVar35._0_8_;
    uStack_c68 = auVar35._8_8_;
    auVar35 = vpinsrw_avx(ZEXT216(uVar65),(uint)uVar65,1);
    auVar35 = vpinsrw_avx(auVar35,(uint)uVar65,2);
    auVar35 = vpinsrw_avx(auVar35,(uint)uVar65,3);
    auVar35 = vpinsrw_avx(auVar35,(uint)uVar65,4);
    auVar35 = vpinsrw_avx(auVar35,(uint)uVar65,5);
    auVar35 = vpinsrw_avx(auVar35,(uint)uVar65,6);
    auVar35 = vpinsrw_avx(auVar35,(uint)uVar65,7);
    auVar36 = vpinsrw_avx(ZEXT216(uVar65),(uint)uVar65,1);
    auVar36 = vpinsrw_avx(auVar36,(uint)uVar65,2);
    auVar36 = vpinsrw_avx(auVar36,(uint)uVar65,3);
    auVar36 = vpinsrw_avx(auVar36,(uint)uVar65,4);
    auVar36 = vpinsrw_avx(auVar36,(uint)uVar65,5);
    auVar36 = vpinsrw_avx(auVar36,(uint)uVar65,6);
    auVar36 = vpinsrw_avx(auVar36,(uint)uVar65,7);
    uStack_c30 = auVar36._0_8_;
    uStack_c28 = auVar36._8_8_;
    local_da0._16_8_ = uStack_c30;
    local_da0._0_16_ = auVar35;
    local_da0._24_8_ = uStack_c28;
    local_dc0._16_8_ = uStack_c70;
    local_dc0._0_16_ = auVar34;
    local_dc0._24_8_ = uStack_c68;
    auVar36 = vpinsrw_avx(ZEXT216(local_d36),(uint)local_d36,1);
    auVar36 = vpinsrw_avx(auVar36,(uint)local_d36,2);
    auVar36 = vpinsrw_avx(auVar36,(uint)local_d36,3);
    auVar36 = vpinsrw_avx(auVar36,(uint)local_d36,4);
    auVar36 = vpinsrw_avx(auVar36,(uint)local_d36,5);
    auVar36 = vpinsrw_avx(auVar36,(uint)local_d36,6);
    auVar36 = vpinsrw_avx(auVar36,(uint)local_d36,7);
    auVar37 = vpinsrw_avx(ZEXT216(local_d36),(uint)local_d36,1);
    auVar37 = vpinsrw_avx(auVar37,(uint)local_d36,2);
    auVar37 = vpinsrw_avx(auVar37,(uint)local_d36,3);
    auVar37 = vpinsrw_avx(auVar37,(uint)local_d36,4);
    auVar37 = vpinsrw_avx(auVar37,(uint)local_d36,5);
    auVar37 = vpinsrw_avx(auVar37,(uint)local_d36,6);
    auVar37 = vpinsrw_avx(auVar37,(uint)local_d36,7);
    uStack_bf0 = auVar37._0_8_;
    uStack_be8 = auVar37._8_8_;
    auVar37 = vpinsrw_avx(ZEXT216(local_cc0),in_R8D & 0xffff,1);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,2);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,3);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,4);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,5);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,6);
    auVar37 = vpinsrw_avx(auVar37,in_R8D & 0xffff,7);
    auVar38 = vpinsrw_avx(ZEXT216(local_cc0),in_R8D & 0xffff,1);
    auVar38 = vpinsrw_avx(auVar38,in_R8D & 0xffff,2);
    auVar38 = vpinsrw_avx(auVar38,in_R8D & 0xffff,3);
    auVar38 = vpinsrw_avx(auVar38,in_R8D & 0xffff,4);
    auVar38 = vpinsrw_avx(auVar38,in_R8D & 0xffff,5);
    auVar38 = vpinsrw_avx(auVar38,in_R8D & 0xffff,6);
    auVar38 = vpinsrw_avx(auVar38,in_R8D & 0xffff,7);
    uStack_bb0 = auVar38._0_8_;
    uStack_ba8 = auVar38._8_8_;
    local_cc4 = (ushort)in_R9D;
    auVar38 = vpinsrw_avx(ZEXT216(local_cc4),in_R9D & 0xffff,1);
    auVar38 = vpinsrw_avx(auVar38,in_R9D & 0xffff,2);
    auVar38 = vpinsrw_avx(auVar38,in_R9D & 0xffff,3);
    auVar38 = vpinsrw_avx(auVar38,in_R9D & 0xffff,4);
    auVar38 = vpinsrw_avx(auVar38,in_R9D & 0xffff,5);
    auVar38 = vpinsrw_avx(auVar38,in_R9D & 0xffff,6);
    auVar38 = vpinsrw_avx(auVar38,in_R9D & 0xffff,7);
    auVar39 = vpinsrw_avx(ZEXT216(local_cc4),in_R9D & 0xffff,1);
    auVar39 = vpinsrw_avx(auVar39,in_R9D & 0xffff,2);
    auVar39 = vpinsrw_avx(auVar39,in_R9D & 0xffff,3);
    auVar39 = vpinsrw_avx(auVar39,in_R9D & 0xffff,4);
    auVar39 = vpinsrw_avx(auVar39,in_R9D & 0xffff,5);
    auVar39 = vpinsrw_avx(auVar39,in_R9D & 0xffff,6);
    auVar39 = vpinsrw_avx(auVar39,in_R9D & 0xffff,7);
    uStack_b70 = auVar39._0_8_;
    uStack_b68 = auVar39._8_8_;
    auVar39 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar39 = vpinsrw_avx(auVar39,1,2);
    auVar39 = vpinsrw_avx(auVar39,1,3);
    auVar39 = vpinsrw_avx(auVar39,1,4);
    auVar39 = vpinsrw_avx(auVar39,1,5);
    auVar39 = vpinsrw_avx(auVar39,1,6);
    auVar39 = vpinsrw_avx(auVar39,1,7);
    auVar40 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar40 = vpinsrw_avx(auVar40,1,2);
    auVar40 = vpinsrw_avx(auVar40,1,3);
    auVar40 = vpinsrw_avx(auVar40,1,4);
    auVar40 = vpinsrw_avx(auVar40,1,5);
    auVar40 = vpinsrw_avx(auVar40,1,6);
    auVar40 = vpinsrw_avx(auVar40,1,7);
    uStack_b30 = auVar40._0_8_;
    uStack_b28 = auVar40._8_8_;
    auVar40 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar40 = vpinsrw_avx(auVar40,0x10,2);
    auVar40 = vpinsrw_avx(auVar40,0x10,3);
    auVar40 = vpinsrw_avx(auVar40,0x10,4);
    auVar40 = vpinsrw_avx(auVar40,0x10,5);
    auVar40 = vpinsrw_avx(auVar40,0x10,6);
    auVar40 = vpinsrw_avx(auVar40,0x10,7);
    auVar41 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar41 = vpinsrw_avx(auVar41,0x10,2);
    auVar41 = vpinsrw_avx(auVar41,0x10,3);
    auVar41 = vpinsrw_avx(auVar41,0x10,4);
    auVar41 = vpinsrw_avx(auVar41,0x10,5);
    auVar41 = vpinsrw_avx(auVar41,0x10,6);
    auVar41 = vpinsrw_avx(auVar41,0x10,7);
    uStack_af0 = auVar41._0_8_;
    uStack_ae8 = auVar41._8_8_;
    uVar65 = local_cc4 * 0x10;
    auVar41 = vpinsrw_avx(ZEXT216(uVar65),(uint)uVar65,1);
    auVar41 = vpinsrw_avx(auVar41,(uint)uVar65,2);
    auVar41 = vpinsrw_avx(auVar41,(uint)uVar65,3);
    auVar41 = vpinsrw_avx(auVar41,(uint)uVar65,4);
    auVar41 = vpinsrw_avx(auVar41,(uint)uVar65,5);
    auVar41 = vpinsrw_avx(auVar41,(uint)uVar65,6);
    auVar41 = vpinsrw_avx(auVar41,(uint)uVar65,7);
    auVar42 = vpinsrw_avx(ZEXT216(uVar65),(uint)uVar65,1);
    auVar42 = vpinsrw_avx(auVar42,(uint)uVar65,2);
    auVar42 = vpinsrw_avx(auVar42,(uint)uVar65,3);
    auVar42 = vpinsrw_avx(auVar42,(uint)uVar65,4);
    auVar42 = vpinsrw_avx(auVar42,(uint)uVar65,5);
    auVar42 = vpinsrw_avx(auVar42,(uint)uVar65,6);
    auVar42 = vpinsrw_avx(auVar42,(uint)uVar65,7);
    uStack_ab0 = auVar42._0_8_;
    uStack_aa8 = auVar42._8_8_;
    auVar42 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
    auVar42 = vpinsrw_avx(auVar42,0xffff,2);
    auVar42 = vpinsrw_avx(auVar42,0xffff,3);
    auVar42 = vpinsrw_avx(auVar42,0xffff,4);
    auVar42 = vpinsrw_avx(auVar42,0xffff,5);
    auVar42 = vpinsrw_avx(auVar42,0xffff,6);
    auVar42 = vpinsrw_avx(auVar42,0xffff,7);
    auVar43 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
    auVar43 = vpinsrw_avx(auVar43,0xffff,2);
    auVar43 = vpinsrw_avx(auVar43,0xffff,3);
    auVar43 = vpinsrw_avx(auVar43,0xffff,4);
    auVar43 = vpinsrw_avx(auVar43,0xffff,5);
    auVar43 = vpinsrw_avx(auVar43,0xffff,6);
    auVar43 = vpinsrw_avx(auVar43,0xffff,7);
    uStack_a70 = auVar43._0_8_;
    uStack_a68 = auVar43._8_8_;
    auVar43 = vpinsrw_avx(ZEXT216(0xf),0xe,1);
    auVar43 = vpinsrw_avx(auVar43,0xd,2);
    auVar43 = vpinsrw_avx(auVar43,0xc,3);
    auVar43 = vpinsrw_avx(auVar43,0xb,4);
    auVar43 = vpinsrw_avx(auVar43,10,5);
    auVar43 = vpinsrw_avx(auVar43,9,6);
    local_ec0._0_16_ = vpinsrw_avx(auVar43,8,7);
    auVar43 = vpinsrw_avx(ZEXT216(7),6,1);
    auVar43 = vpinsrw_avx(auVar43,5,2);
    auVar43 = vpinsrw_avx(auVar43,4,3);
    auVar43 = vpinsrw_avx(auVar43,3,4);
    auVar43 = vpinsrw_avx(auVar43,2,5);
    auVar43 = vpinsrw_avx(auVar43,1,6);
    auVar43 = vpinsrw_avx(auVar43,0,7);
    uStack_8f0 = auVar43._0_8_;
    uStack_8e8 = auVar43._8_8_;
    local_ec0._16_8_ = uStack_8f0;
    local_ec0._24_8_ = uStack_8e8;
    auVar43 = vpinsrw_avx(ZEXT216(0xfff1),0xfff2,1);
    auVar43 = vpinsrw_avx(auVar43,0xfff3,2);
    auVar43 = vpinsrw_avx(auVar43,0xfff4,3);
    auVar43 = vpinsrw_avx(auVar43,0xfff5,4);
    auVar43 = vpinsrw_avx(auVar43,0xfff6,5);
    auVar43 = vpinsrw_avx(auVar43,0xfff7,6);
    auVar43 = vpinsrw_avx(auVar43,0xfff8,7);
    auVar44 = vpinsrw_avx(ZEXT216(0xfff9),0xfffa,1);
    auVar44 = vpinsrw_avx(auVar44,0xfffb,2);
    auVar44 = vpinsrw_avx(auVar44,0xfffc,3);
    auVar44 = vpinsrw_avx(auVar44,0xfffd,4);
    auVar44 = vpinsrw_avx(auVar44,0xfffe,5);
    auVar44 = vpinsrw_avx(auVar44,0xffff,6);
    auVar44 = vpinsrw_avx(auVar44,0,7);
    uStack_930 = auVar44._0_8_;
    uStack_928 = auVar44._8_8_;
    local_f00._16_8_ = uStack_bf0;
    local_f00._0_16_ = auVar36;
    uStack_ee8 = uStack_be8;
    local_cd4 = (ushort)local_1188;
    auVar44 = vpinsrw_avx(ZEXT216(local_cd4),local_1188 & 0xffff,1);
    auVar44 = vpinsrw_avx(auVar44,local_1188 & 0xffff,2);
    auVar44 = vpinsrw_avx(auVar44,local_1188 & 0xffff,3);
    auVar44 = vpinsrw_avx(auVar44,local_1188 & 0xffff,4);
    auVar44 = vpinsrw_avx(auVar44,local_1188 & 0xffff,5);
    auVar44 = vpinsrw_avx(auVar44,local_1188 & 0xffff,6);
    auVar44 = vpinsrw_avx(auVar44,local_1188 & 0xffff,7);
    auVar45 = vpinsrw_avx(ZEXT216(local_cd4),local_1188 & 0xffff,1);
    auVar45 = vpinsrw_avx(auVar45,local_1188 & 0xffff,2);
    auVar45 = vpinsrw_avx(auVar45,local_1188 & 0xffff,3);
    auVar45 = vpinsrw_avx(auVar45,local_1188 & 0xffff,4);
    auVar45 = vpinsrw_avx(auVar45,local_1188 & 0xffff,5);
    auVar45 = vpinsrw_avx(auVar45,local_1188 & 0xffff,6);
    auVar45 = vpinsrw_avx(auVar45,local_1188 & 0xffff,7);
    uStack_a30 = auVar45._0_8_;
    uStack_a28 = auVar45._8_8_;
    auVar73._16_8_ = uStack_a30;
    auVar73._0_16_ = auVar44;
    auVar73._24_8_ = uStack_a28;
    auVar46._16_8_ = uStack_b30;
    auVar46._0_16_ = auVar39;
    auVar46._24_8_ = uStack_b28;
    auVar46 = vpsubsw_avx2(auVar73,auVar46);
    local_cbc = (ushort)in_ECX;
    auVar44 = vpinsrw_avx(ZEXT216(local_cbc),in_ECX & 0xffff,1);
    auVar44 = vpinsrw_avx(auVar44,in_ECX & 0xffff,2);
    auVar44 = vpinsrw_avx(auVar44,in_ECX & 0xffff,3);
    auVar44 = vpinsrw_avx(auVar44,in_ECX & 0xffff,4);
    auVar44 = vpinsrw_avx(auVar44,in_ECX & 0xffff,5);
    auVar44 = vpinsrw_avx(auVar44,in_ECX & 0xffff,6);
    auVar44 = vpinsrw_avx(auVar44,in_ECX & 0xffff,7);
    auVar45 = vpinsrw_avx(ZEXT216(local_cbc),in_ECX & 0xffff,1);
    auVar45 = vpinsrw_avx(auVar45,in_ECX & 0xffff,2);
    auVar45 = vpinsrw_avx(auVar45,in_ECX & 0xffff,3);
    auVar45 = vpinsrw_avx(auVar45,in_ECX & 0xffff,4);
    auVar45 = vpinsrw_avx(auVar45,in_ECX & 0xffff,5);
    auVar45 = vpinsrw_avx(auVar45,in_ECX & 0xffff,6);
    auVar45 = vpinsrw_avx(auVar45,in_ECX & 0xffff,7);
    uStack_9f0 = auVar45._0_8_;
    uStack_9e8 = auVar45._8_8_;
    auVar71._16_8_ = uStack_9f0;
    auVar71._0_16_ = auVar44;
    auVar71._24_8_ = uStack_9e8;
    auVar47._16_8_ = uStack_b30;
    auVar47._0_16_ = auVar39;
    auVar47._24_8_ = uStack_b28;
    auVar47 = vpsubsw_avx2(auVar71,auVar47);
    sVar70 = (short)-in_R8D;
    sVar66 = (short)(in_R9D << 2);
    sVar48 = (short)(in_R9D << 3);
    auVar44 = vpinsrw_avx(ZEXT216((ushort)((local_cc4 - sVar48) - local_cc0)),
                          (uint)(ushort)(sVar70 + local_cc4 * -6),1);
    auVar44 = vpinsrw_avx(auVar44,(uint)(ushort)(sVar70 + local_cc4 * -5),2);
    auVar44 = vpinsrw_avx(auVar44,(uint)(ushort)(sVar70 - sVar66),3);
    auVar44 = vpinsrw_avx(auVar44,(uint)(ushort)(sVar70 + local_cc4 * -3),4);
    auVar44 = vpinsrw_avx(auVar44,(uint)(ushort)(sVar70 + local_cc4 * -2),5);
    auVar44 = vpinsrw_avx(auVar44,(uint)(ushort)(sVar70 - local_cc4),6);
    auVar44 = vpinsrw_avx(auVar44,-in_R8D & 0xffff,7);
    auVar45 = vpinsrw_avx(ZEXT216((ushort)(sVar70 + local_cc4 * -0xf)),
                          (uint)(ushort)((local_cc4 * 2 - (short)(in_R9D << 4)) - local_cc0),1);
    auVar45 = vpinsrw_avx(auVar45,(uint)(ushort)(sVar70 + local_cc4 * -0xd),2);
    auVar45 = vpinsrw_avx(auVar45,(uint)(ushort)(sVar70 + sVar66 * -3),3);
    auVar45 = vpinsrw_avx(auVar45,(uint)(ushort)(sVar70 + local_cc4 * -0xb),4);
    auVar45 = vpinsrw_avx(auVar45,(uint)(ushort)(sVar70 + local_cc4 * -10),5);
    auVar45 = vpinsrw_avx(auVar45,(uint)(ushort)(sVar70 + local_cc4 * -9),6);
    auVar45 = vpinsrw_avx(auVar45,(uint)(ushort)(sVar70 - sVar48),7);
    auVar72 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
    uStack_970 = auVar72._0_8_;
    uStack_968 = auVar72._8_8_;
    local_fa0._16_8_ = uStack_970;
    local_fa0._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar45;
    local_fa0._24_8_ = uStack_968;
    auVar76 = ZEXT1664(auVar44);
    local_ca0 = parasail_result_new_table1(local_1188,in_ECX);
    if (local_ca0 == (parasail_result_t *)0x0) {
      local_ca0 = (parasail_result_t *)0x0;
    }
    else {
      local_ca0->flag = local_ca0->flag | 0x10201001;
      local_ca0->flag = local_ca0->flag | 0x20000;
      ptr = parasail_memalign_int16_t(0x20,(long)(int)(in_ECX + 0x1e));
      ptr_00 = parasail_memalign_int16_t(0x20,(long)(int)(in_ECX + 0x1e));
      ptr_01 = parasail_memalign_int16_t(0x20,(long)(int)(in_ECX + 0x1e));
      piVar68 = ptr + 0xf;
      if (ptr == (int16_t *)0x0) {
        local_ca0 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        local_ca0 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        local_ca0 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_ce8 = parasail_memalign_int16_t(0x20,(long)(int)(local_1188 + 0xf));
          if (local_ce8 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_d24 = 0; (int)local_d24 < (int)local_1188; local_d24 = local_d24 + 1) {
            local_ce8[(int)local_d24] =
                 (int16_t)*(undefined4 *)
                           (*(long *)(in_stack_00000008 + 0x10) +
                           (ulong)*(byte *)(in_RDI + (int)local_d24) * 4);
          }
          for (local_d24 = local_1188; (int)local_d24 < (int)(local_1188 + 0xf);
              local_d24 = local_d24 + 1) {
            local_ce8[(int)local_d24] = 0;
          }
        }
        for (local_d28 = 0; (int)local_d28 < (int)in_ECX; local_d28 = local_d28 + 1) {
          piVar68[(int)local_d28] =
               (int16_t)*(undefined4 *)
                         (*(long *)(in_stack_00000008 + 0x10) +
                         (ulong)*(byte *)(in_RDX + (int)local_d28) * 4);
        }
        for (local_d28 = -0xf; uVar64 = in_ECX, (int)local_d28 < 0; local_d28 = local_d28 + 1) {
          piVar68[(int)local_d28] = 0;
        }
        while (local_d28 = uVar64, (int)local_d28 < (int)(in_ECX + 0xf)) {
          piVar68[(int)local_d28] = 0;
          uVar64 = local_d28 + 1;
        }
        for (local_d28 = 0; (int)local_d28 < (int)in_ECX; local_d28 = local_d28 + 1) {
          ptr_00[(long)(int)local_d28 + 0xf] = -((short)local_d28 * local_cc4) - local_cc0;
          ptr_01[(long)(int)local_d28 + 0xf] = local_d36;
        }
        for (local_d28 = -0xf; uVar64 = in_ECX, (int)local_d28 < 0; local_d28 = local_d28 + 1) {
          ptr_00[(long)(int)local_d28 + 0xf] = local_d36;
          ptr_01[(long)(int)local_d28 + 0xf] = local_d36;
        }
        while (local_d28 = uVar64, (int)local_d28 < (int)(in_ECX + 0xf)) {
          ptr_00[(long)(int)local_d28 + 0xf] = local_d36;
          ptr_01[(long)(int)local_d28 + 0xf] = local_d36;
          uVar64 = local_d28 + 1;
        }
        ptr_00[0xe] = 0;
        for (local_d24 = 0; (int)local_d24 < (int)local_1188; local_d24 = local_d24 + 0x10) {
          local_fc0._16_8_ = uStack_bf0;
          local_fc0._0_16_ = auVar36;
          uStack_fa8 = uStack_be8;
          local_fe0._16_8_ = uStack_bf0;
          local_fe0._0_16_ = auVar36;
          uStack_fc8 = uStack_be8;
          local_1000._16_8_ = uStack_bf0;
          local_1000._0_16_ = auVar36;
          local_1000._24_8_ = uStack_be8;
          local_1020._16_8_ = uStack_bf0;
          local_1020._0_16_ = auVar36;
          uStack_1008 = uStack_be8;
          local_1040._16_8_ = uStack_930;
          local_1040._0_16_ = auVar43;
          local_1040._24_8_ = uStack_928;
          lVar20 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_11dc = (int)local_ce8[(int)local_d24];
          }
          else {
            if ((int)local_d24 < (int)local_1188) {
              local_11e0 = local_d24;
            }
            else {
              local_11e0 = local_1188 - 1;
            }
            local_11dc = local_11e0;
          }
          lVar21 = *(long *)(in_stack_00000008 + 8);
          iVar7 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_11f4 = (int)local_ce8[(int)(local_d24 + 1)];
          }
          else {
            if ((int)(local_d24 + 1) < (int)local_1188) {
              local_11f8 = local_d24 + 1;
            }
            else {
              local_11f8 = local_1188 - 1;
            }
            local_11f4 = local_11f8;
          }
          lVar22 = *(long *)(in_stack_00000008 + 8);
          iVar8 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_120c = (int)local_ce8[(int)(local_d24 + 2)];
          }
          else {
            if ((int)(local_d24 + 2) < (int)local_1188) {
              local_1210 = local_d24 + 2;
            }
            else {
              local_1210 = local_1188 - 1;
            }
            local_120c = local_1210;
          }
          lVar23 = *(long *)(in_stack_00000008 + 8);
          iVar9 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1224 = (int)local_ce8[(int)(local_d24 + 3)];
          }
          else {
            if ((int)(local_d24 + 3) < (int)local_1188) {
              local_1228 = local_d24 + 3;
            }
            else {
              local_1228 = local_1188 - 1;
            }
            local_1224 = local_1228;
          }
          lVar24 = *(long *)(in_stack_00000008 + 8);
          iVar10 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_123c = (int)local_ce8[(int)(local_d24 + 4)];
          }
          else {
            if ((int)(local_d24 + 4) < (int)local_1188) {
              local_1240 = local_d24 + 4;
            }
            else {
              local_1240 = local_1188 - 1;
            }
            local_123c = local_1240;
          }
          lVar25 = *(long *)(in_stack_00000008 + 8);
          iVar11 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1254 = (int)local_ce8[(int)(local_d24 + 5)];
          }
          else {
            if ((int)(local_d24 + 5) < (int)local_1188) {
              local_1258 = local_d24 + 5;
            }
            else {
              local_1258 = local_1188 - 1;
            }
            local_1254 = local_1258;
          }
          lVar26 = *(long *)(in_stack_00000008 + 8);
          iVar12 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_126c = (int)local_ce8[(int)(local_d24 + 6)];
          }
          else {
            if ((int)(local_d24 + 6) < (int)local_1188) {
              local_1270 = local_d24 + 6;
            }
            else {
              local_1270 = local_1188 - 1;
            }
            local_126c = local_1270;
          }
          lVar27 = *(long *)(in_stack_00000008 + 8);
          iVar13 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1284 = (int)local_ce8[(int)(local_d24 + 7)];
          }
          else {
            if ((int)(local_d24 + 7) < (int)local_1188) {
              local_1288 = local_d24 + 7;
            }
            else {
              local_1288 = local_1188 - 1;
            }
            local_1284 = local_1288;
          }
          lVar28 = *(long *)(in_stack_00000008 + 8);
          iVar14 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_129c = (int)local_ce8[(int)(local_d24 + 8)];
          }
          else {
            if ((int)(local_d24 + 8) < (int)local_1188) {
              local_12a0 = local_d24 + 8;
            }
            else {
              local_12a0 = local_1188 - 1;
            }
            local_129c = local_12a0;
          }
          lVar29 = *(long *)(in_stack_00000008 + 8);
          iVar15 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12b4 = (int)local_ce8[(int)(local_d24 + 9)];
          }
          else {
            if ((int)(local_d24 + 9) < (int)local_1188) {
              local_12b8 = local_d24 + 9;
            }
            else {
              local_12b8 = local_1188 - 1;
            }
            local_12b4 = local_12b8;
          }
          lVar30 = *(long *)(in_stack_00000008 + 8);
          iVar16 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12cc = (int)local_ce8[(int)(local_d24 + 10)];
          }
          else {
            if ((int)(local_d24 + 10) < (int)local_1188) {
              local_12d0 = local_d24 + 10;
            }
            else {
              local_12d0 = local_1188 - 1;
            }
            local_12cc = local_12d0;
          }
          lVar31 = *(long *)(in_stack_00000008 + 8);
          iVar17 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12e4 = (int)local_ce8[(int)(local_d24 + 0xb)];
          }
          else {
            if ((int)(local_d24 + 0xb) < (int)local_1188) {
              local_12e8 = local_d24 + 0xb;
            }
            else {
              local_12e8 = local_1188 - 1;
            }
            local_12e4 = local_12e8;
          }
          lVar32 = *(long *)(in_stack_00000008 + 8);
          iVar18 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_12fc = (int)local_ce8[(int)(local_d24 + 0xc)];
          }
          else {
            if ((int)(local_d24 + 0xc) < (int)local_1188) {
              local_1300 = local_d24 + 0xc;
            }
            else {
              local_1300 = local_1188 - 1;
            }
            local_12fc = local_1300;
          }
          lVar33 = *(long *)(in_stack_00000008 + 8);
          iVar19 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1314 = (int)local_ce8[(int)(local_d24 + 0xd)];
          }
          else {
            if ((int)(local_d24 + 0xd) < (int)local_1188) {
              local_1318 = local_d24 + 0xd;
            }
            else {
              local_1318 = local_1188 - 1;
            }
            local_1314 = local_1318;
          }
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_132c = (int)local_ce8[(int)(local_d24 + 0xe)];
          }
          else {
            if ((int)(local_d24 + 0xe) < (int)local_1188) {
              local_1330 = local_d24 + 0xe;
            }
            else {
              local_1330 = local_1188 - 1;
            }
            local_132c = local_1330;
          }
          lVar69 = *(long *)(in_stack_00000008 + 8) +
                   (long)(*(int *)(in_stack_00000008 + 0x18) * local_132c) * 4;
          array = *(int **)(in_stack_00000008 + 8);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1344 = (int)local_ce8[(int)(local_d24 + 0xf)];
          }
          else {
            if ((int)(local_d24 + 0xf) < (int)local_1188) {
              local_1348 = local_d24 + 0xf;
            }
            else {
              local_1348 = local_1188 - 1;
            }
            local_1344 = local_1348;
          }
          piVar1 = array + *(int *)(in_stack_00000008 + 0x18) * local_1344;
          auVar73 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff050),0xe);
          auVar71 = vpsrldq_avx2(_local_fc0,2);
          auVar73 = vpor_avx2(auVar73,auVar71);
          iVar2 = ptr_00[0xe];
          auVar74._2_2_ = iVar2;
          auVar74._0_2_ = iVar2;
          auVar74._4_2_ = iVar2;
          auVar74._6_2_ = iVar2;
          auVar74._8_2_ = iVar2;
          auVar74._10_2_ = iVar2;
          auVar74._12_2_ = iVar2;
          auVar74._14_2_ = iVar2;
          auVar74._16_2_ = iVar2;
          auVar74._18_2_ = iVar2;
          auVar74._20_2_ = iVar2;
          auVar74._22_2_ = iVar2;
          auVar74._24_2_ = iVar2;
          auVar74._26_2_ = iVar2;
          auVar74._28_2_ = iVar2;
          auVar74._30_2_ = iVar2;
          auVar71 = vpblendw_avx2(auVar73,auVar74,0x80);
          _local_fc0 = vpblendd_avx2(auVar73,auVar71,0xf0);
          auVar73 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff030),0xe);
          auVar71 = vpsrldq_avx2(_local_fe0,2);
          auVar73 = vpor_avx2(auVar73,auVar71);
          sVar66 = -(local_cc0 + (short)local_d24 * local_cc4);
          auVar75._2_2_ = sVar66;
          auVar75._0_2_ = sVar66;
          auVar75._4_2_ = sVar66;
          auVar75._6_2_ = sVar66;
          auVar75._8_2_ = sVar66;
          auVar75._10_2_ = sVar66;
          auVar75._12_2_ = sVar66;
          auVar75._14_2_ = sVar66;
          auVar75._16_2_ = sVar66;
          auVar75._18_2_ = sVar66;
          auVar75._20_2_ = sVar66;
          auVar75._22_2_ = sVar66;
          auVar75._24_2_ = sVar66;
          auVar75._26_2_ = sVar66;
          auVar75._28_2_ = sVar66;
          auVar75._30_2_ = sVar66;
          auVar71 = vpblendw_avx2(auVar73,auVar75,0x80);
          _local_fe0 = vpblendd_avx2(auVar73,auVar71,0xf0);
          ptr_00[0xe] = -(((short)local_d24 + 0x10) * local_cc4) - local_cc0;
          for (local_d28 = 0; auVar71 = _local_fc0, (int)local_d28 < (int)(in_ECX + 0xf);
              local_d28 = local_d28 + 1) {
            auVar74 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff030),0xe);
            auVar73 = vpsrldq_avx2(_local_fe0,2);
            auVar73 = vpor_avx2(auVar74,auVar73);
            _local_fc0 = auVar73._0_30_;
            uStack_fa8._6_2_ = ptr_00[(long)(int)local_d28 + 0xf];
            auVar75 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeff0),0xe);
            auVar74 = vpsrldq_avx2(_local_1020,2);
            auVar74 = vpor_avx2(auVar75,auVar74);
            _local_1020 = auVar74._0_30_;
            uStack_1008._6_2_ = ptr_01[(long)(int)local_d28 + 0xf];
            auVar55._24_8_ = uStack_fa8;
            auVar55._0_24_ = auVar73._0_24_;
            auVar54._16_8_ = uStack_bb0;
            auVar54._0_16_ = auVar37;
            auVar54._24_8_ = uStack_ba8;
            auVar73 = vpsubsw_avx2(auVar55,auVar54);
            auVar53._24_8_ = uStack_1008;
            auVar53._0_24_ = auVar74._0_24_;
            auVar52._16_8_ = uStack_b70;
            auVar52._0_16_ = auVar38;
            auVar52._24_8_ = uStack_b68;
            auVar74 = vpsubsw_avx2(auVar53,auVar52);
            auVar73 = vpmaxsw_avx2(auVar73,auVar74);
            auVar51._16_8_ = uStack_bb0;
            auVar51._0_16_ = auVar37;
            auVar51._24_8_ = uStack_ba8;
            auVar74 = vpsubsw_avx2(_local_fe0,auVar51);
            auVar50._16_8_ = uStack_b70;
            auVar50._0_16_ = auVar38;
            auVar50._24_8_ = uStack_b68;
            auVar75 = vpsubsw_avx2(local_1000,auVar50);
            auVar74 = vpmaxsw_avx2(auVar74,auVar75);
            uVar65 = *(ushort *)
                      (lVar20 + (long)(iVar6 * local_11dc) * 4 + (long)piVar68[(int)local_d28] * 4);
            uVar3 = *(ushort *)
                     (lVar21 + (long)(iVar7 * local_11f4) * 4 +
                     (long)piVar68[(int)(local_d28 + -1)] * 4);
            uVar4 = *(ushort *)(lVar69 + (long)piVar68[(int)(local_d28 + -0xe)] * 4);
            uVar5 = *(ushort *)(piVar1 + piVar68[(int)(local_d28 + -0xf)]);
            auVar44 = vpinsrw_avx(ZEXT216(uVar5),(uint)uVar4,1);
            auVar44 = vpinsrw_avx(auVar44,(uint)*(ushort *)
                                                 (lVar33 + (long)(iVar19 * local_1314) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -0xd)] * 4),2);
            auVar44 = vpinsrw_avx(auVar44,(uint)*(ushort *)
                                                 (lVar32 + (long)(iVar18 * local_12fc) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -0xc)] * 4),3);
            auVar44 = vpinsrw_avx(auVar44,(uint)*(ushort *)
                                                 (lVar31 + (long)(iVar17 * local_12e4) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -0xb)] * 4),4);
            auVar44 = vpinsrw_avx(auVar44,(uint)*(ushort *)
                                                 (lVar30 + (long)(iVar16 * local_12cc) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -10)] * 4),5);
            auVar44 = vpinsrw_avx(auVar44,(uint)*(ushort *)
                                                 (lVar29 + (long)(iVar15 * local_12b4) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -9)] * 4),6);
            auVar44 = vpinsrw_avx(auVar44,(uint)*(ushort *)
                                                 (lVar28 + (long)(iVar14 * local_129c) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -8)] * 4),7);
            auVar45 = vpinsrw_avx(ZEXT216(*(ushort *)
                                           (lVar27 + (long)(iVar13 * local_1284) * 4 +
                                           (long)piVar68[(int)(local_d28 + -7)] * 4)),
                                  (uint)*(ushort *)
                                         (lVar26 + (long)(iVar12 * local_126c) * 4 +
                                         (long)piVar68[(int)(local_d28 + -6)] * 4),1);
            auVar45 = vpinsrw_avx(auVar45,(uint)*(ushort *)
                                                 (lVar25 + (long)(iVar11 * local_1254) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -5)] * 4),2);
            auVar45 = vpinsrw_avx(auVar45,(uint)*(ushort *)
                                                 (lVar24 + (long)(iVar10 * local_123c) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -4)] * 4),3);
            auVar45 = vpinsrw_avx(auVar45,(uint)*(ushort *)
                                                 (lVar23 + (long)(iVar9 * local_1224) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -3)] * 4),4);
            auVar45 = vpinsrw_avx(auVar45,(uint)*(ushort *)
                                                 (lVar22 + (long)(iVar8 * local_120c) * 4 +
                                                 (long)piVar68[(int)(local_d28 + -2)] * 4),5);
            auVar45 = vpinsrw_avx(auVar45,(uint)uVar3,6);
            auVar45 = vpinsrw_avx(auVar45,(uint)uVar65,7);
            uStack_9b0 = auVar45._0_8_;
            uStack_9a8 = auVar45._8_8_;
            auVar58._16_8_ = uStack_9b0;
            auVar58._0_16_ = auVar44;
            auVar58._24_8_ = uStack_9a8;
            auVar71 = vpaddsw_avx2(auVar71,auVar58);
            auVar71 = vpmaxsw_avx2(auVar71,auVar74);
            auVar75 = vpmaxsw_avx2(auVar71,auVar73);
            auVar59._16_8_ = uStack_a70;
            auVar59._0_16_ = auVar42;
            auVar59._24_8_ = uStack_a68;
            auVar71 = vpcmpeqw_avx2(local_1040,auVar59);
            _local_fe0 = vpblendvb_avx2(auVar75,local_fa0,auVar71);
            auVar61._16_8_ = uStack_bf0;
            auVar61._0_16_ = auVar36;
            auVar61._24_8_ = uStack_be8;
            _local_1020 = vpblendvb_avx2(auVar73,auVar61,auVar71);
            auVar60._16_8_ = uStack_bf0;
            auVar60._0_16_ = auVar36;
            auVar60._24_8_ = uStack_be8;
            local_1000 = vpblendvb_avx2(auVar74,auVar60,auVar71);
            if (0xf < (int)local_d28) {
              local_da0 = vpminsw_avx2(local_da0,_local_fe0);
              local_dc0 = vpmaxsw_avx2(local_dc0,_local_fe0);
            }
            vWH_00[1]._0_4_ = in_stack_ffffffffffffeca0;
            vWH_00[0] = (longlong)piVar68;
            vWH_00[1]._4_4_ = local_d28;
            vWH_00[2] = (longlong)piVar1;
            vWH_00[3]._0_2_ = uVar4;
            vWH_00[3]._2_2_ = uVar65;
            vWH_00[3]._4_2_ = uVar3;
            vWH_00[3]._6_2_ = uVar5;
            arr_store_si256(array,vWH_00,(int32_t)((ulong)lVar69 >> 0x20),(int32_t)lVar69,
                            in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88);
            ptr_00[(long)(int)(local_d28 + -0xf) + 0xf] = local_fe0._0_2_;
            ptr_01[(long)(int)(local_d28 + -0xf) + 0xf] = local_1020._0_2_;
            auVar71 = vpcmpeqw_avx2(local_ec0,auVar46);
            auVar73 = vpcmpeqw_avx2(local_1040,auVar47);
            auVar71 = vpand_avx2(auVar71,auVar73);
            _local_f00 = vpblendvb_avx2(_local_f00,_local_fe0,auVar71);
            auVar57._16_8_ = uStack_b30;
            auVar57._0_16_ = auVar39;
            auVar57._24_8_ = uStack_b28;
            local_1040 = vpaddsw_avx2(local_1040,auVar57);
          }
          auVar56._16_8_ = uStack_af0;
          auVar56._0_16_ = auVar40;
          auVar56._24_8_ = uStack_ae8;
          local_ec0 = vpaddsw_avx2(local_ec0,auVar56);
          auVar49._16_8_ = uStack_ab0;
          auVar49._0_16_ = auVar41;
          auVar49._24_8_ = uStack_aa8;
          auVar76 = ZEXT3264(auVar49);
          local_fa0 = vpsubsw_avx2(local_fa0,auVar49);
        }
        for (local_d24 = 0; (int)local_d24 < 0x10; local_d24 = local_d24 + 1) {
          uVar67 = vpextrw_avx(stack0xfffffffffffff110,7);
          if ((short)local_d36 < (short)(ushort)uVar67) {
            local_d36 = (ushort)uVar67;
          }
          auVar46 = vperm2i128_avx2(auVar76._0_32_,_local_f00,0x28);
          auVar76 = ZEXT3264(auVar46);
          _local_f00 = vpalignr_avx2(_local_f00,auVar46,0xe);
        }
        auVar63._16_8_ = uStack_c70;
        auVar63._0_16_ = auVar34;
        auVar63._24_8_ = uStack_c68;
        auVar46 = vpcmpgtw_avx2(auVar63,local_da0);
        auVar62._16_8_ = uStack_c30;
        auVar62._0_16_ = auVar35;
        auVar62._24_8_ = uStack_c28;
        auVar47 = vpcmpgtw_avx2(local_dc0,auVar62);
        auVar46 = vpor_avx2(auVar46,auVar47);
        if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar46 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar46 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar46 >> 0x7f,0) != '\0') ||
                          (auVar46 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar46 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar46 >> 0xbf,0) != '\0') ||
                  (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar46[0x1f] < '\0') {
          local_ca0->flag = local_ca0->flag | 0x40;
          local_d36 = 0;
          local_d2c = 0;
          local_d30 = 0;
        }
        local_ca0->score = (int)(short)local_d36;
        local_ca0->end_query = local_d2c;
        local_ca0->end_ref = local_d30;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_ce8);
        }
      }
    }
  }
  return local_ca0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, -open - i*gap, 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi16(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm256_extract_epi16_rpl(vMax, 15);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 2);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}